

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Ref<embree::Image> embree::loadImageFromDisk(FileName *fileName)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  runtime_error *this;
  Image *in_RDI;
  FileName *in_stack_00000078;
  FileName *in_stack_00000080;
  string ext;
  FileName *in_stack_00000270;
  FileName *in_stack_00000290;
  FileName *in_stack_00000310;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff38;
  FileName *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string local_80 [32];
  undefined4 local_60;
  string local_50 [32];
  string local_30 [48];
  
  FileName::ext_abi_cxx11_(in_stack_ffffffffffffff68);
  toLowerCase(in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_50);
  uVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if ((bool)uVar1) {
    loadSTB(in_stack_00000078);
  }
  else {
    uVar2 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if ((bool)uVar2) {
      loadSTB(in_stack_00000078);
    }
    else {
      uVar3 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if ((bool)uVar3) {
        loadSTB(in_stack_00000078);
      }
      else {
        uVar4 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if ((bool)uVar4) {
          loadEXR(in_stack_00000080);
        }
        else {
          uVar5 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          if ((bool)uVar5) {
            loadPFM(in_stack_00000270);
          }
          else {
            uVar6 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
            if ((bool)uVar6) {
              loadPPM(in_stack_00000310);
            }
            else {
              uVar7 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
              if (!(bool)uVar7) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+((char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  uVar5,CONCAT12(uVar6,CONCAT11(uVar7,
                                                  in_stack_ffffffffffffff38))))))),(char *)this);
                std::runtime_error::runtime_error(this,local_80);
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              loadTGA(in_stack_00000290);
            }
          }
        }
      }
    }
  }
  local_60 = 1;
  std::__cxx11::string::~string(local_30);
  return (Ref<embree::Image>)in_RDI;
}

Assistant:

Ref<Image> loadImageFromDisk(const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());

    if (ext == "bmp" ) return loadSTB(fileName);
    if (ext == "png" ) return loadSTB(fileName);
    if (ext == "jpg" ) return loadSTB(fileName);

    if (ext == "exr" ) return loadEXR(fileName);
    
    if (ext == "pfm" ) return loadPFM(fileName);
    if (ext == "ppm" ) return loadPPM(fileName);
    if (ext == "tga" ) return loadTGA(fileName);
    THROW_RUNTIME_ERROR("image format " + ext + " not supported");
  }